

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O3

void __thiscall LSL_RLE<TTA>::FirstScan(LSL_RLE<TTA> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  uint **ppuVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar10 = *(int *)&pMVar2->field_0x8;
  lVar19 = (long)iVar10;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  if (0 < lVar19) {
    lVar8 = 0;
    do {
      ppuVar3 = (this->RLC).prows;
      puVar4 = ppuVar3[lVar8];
      uVar15 = 0;
      uVar16 = 0;
      uVar14 = 0;
      if (0 < (int)uVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        puVar5 = (this->ER).prows[lVar8];
        lVar18 = **(long **)&pMVar2->field_0x48;
        lVar12 = *(long *)&pMVar2->field_0x10;
        uVar17 = 0;
        uVar16 = 0;
        uVar15 = 0;
        uVar13 = 0;
        do {
          uVar14 = (uint)(*(char *)(lVar18 * lVar8 + lVar12 + uVar17) != '\0');
          if (uVar13 != uVar14) {
            puVar4[(int)uVar15] = (int)uVar17 - uVar16;
            uVar16 = uVar16 ^ 1;
            uVar15 = uVar15 + 1;
          }
          puVar5[uVar17] = uVar15;
          uVar17 = uVar17 + 1;
          uVar13 = uVar14;
        } while (uVar1 != uVar17);
      }
      puVar4[(int)uVar15] = uVar1 - uVar16;
      this->ner[lVar8] = uVar15 + uVar14;
      ppuVar3[lVar8 + 1] = puVar4 + (long)(int)(uVar15 + uVar14) + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar19);
  }
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  memset(*(this->ERA).prows,0,(long)(int)((uVar1 + 1) * iVar10) << 2);
  puVar7 = TTA::tail_;
  puVar5 = TTA::next_;
  puVar4 = TTA::rtable_;
  piVar9 = this->ner;
  if (0 < *piVar9) {
    puVar6 = *(this->ERA).prows;
    lVar8 = 1;
    do {
      uVar17 = (ulong)TTA::length_;
      puVar4[uVar17] = TTA::length_;
      puVar5[uVar17] = 0xffffffff;
      puVar7[TTA::length_] = TTA::length_;
      uVar14 = TTA::length_ + 1;
      puVar6[lVar8] = TTA::length_;
      TTA::length_ = uVar14;
      lVar8 = lVar8 + 2;
    } while (lVar8 <= *piVar9);
  }
  if (1 < iVar10) {
    lVar8 = 1;
    do {
      if (0 < piVar9[lVar8]) {
        ppuVar3 = (this->ERA).prows;
        puVar4 = ppuVar3[lVar8 + -1];
        puVar5 = ppuVar3[lVar8];
        puVar7 = (this->ER).prows[lVar8 + -1];
        puVar6 = (this->RLC).prows[lVar8];
        lVar18 = 1;
        do {
          uVar14 = puVar6[lVar18 + -1];
          uVar15 = puVar6[lVar18];
          uVar15 = puVar7[(int)(((int)uVar15 < (int)(uVar1 - 1)) + uVar15)];
          uVar17 = (long)(int)puVar7[(int)(uVar14 - (0 < (int)uVar14))] | 1;
          iVar11 = uVar15 + (uVar15 & 1) + -1;
          iVar10 = (int)uVar17;
          if (iVar11 < iVar10) {
            uVar17 = (ulong)TTA::length_;
            TTA::rtable_[uVar17] = TTA::length_;
            TTA::next_[uVar17] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar14 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
          }
          else {
            uVar14 = TTA::rtable_[puVar4[uVar17]];
            iVar10 = iVar10 + 2;
            if (iVar10 <= iVar11) {
              lVar12 = (long)iVar10;
              do {
                uVar15 = TTA::rtable_[puVar4[lVar12]];
                if ((int)uVar14 < (int)uVar15) {
                  TTA::UpdateTable(uVar15,uVar14);
                }
                if ((int)uVar15 < (int)uVar14) {
                  TTA::UpdateTable(uVar14,uVar15);
                  uVar14 = uVar15;
                }
                lVar12 = lVar12 + 2;
              } while (lVar12 <= iVar11);
              piVar9 = this->ner;
            }
          }
          puVar5[lVar18] = uVar14;
          lVar18 = lVar18 + 2;
        } while ((int)lVar18 <= piVar9[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar19);
  }
  return;
}

Assistant:

void FirstScan()
    {
        int rows = img_.rows;
        int cols = img_.cols;

        // Step 1
        for (int r = 0; r < rows; ++r) {
            // Get pointers to rows
            const unsigned char* img_r = img_.ptr<unsigned char>(r);
            unsigned* ER_r = ER.prows[r];
            unsigned* RLC_r = RLC.prows[r];
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c) {
                x0 = img_r[c] > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC_r[er] = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER_r[c] = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC_r[er] = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
            // Compact RLC usage
            RLC.prows[r + 1] = RLC_r + er + 1;
        }